

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureCommand.cxx
# Opt level: O0

cmCTestGenericHandler * __thiscall
cmCTestConfigureCommand::InitializeHandler(cmCTestConfigureCommand *this)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  ostream *poVar8;
  cmake *gname;
  pointer pcVar9;
  char *pcVar10;
  string *psVar11;
  cmCTestConfigureHandler *handler;
  string local_4d8;
  cmValue local_4b8;
  cmValue labelsForSubprojects;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  string local_460;
  string *local_440;
  allocator<char> local_431;
  string local_430;
  cmValue local_410;
  cmValue cmakeGeneratorToolset;
  allocator<char> local_3f9;
  string local_3f8;
  cmValue local_3d8;
  cmValue cmakeGeneratorPlatform;
  string local_3c8;
  reference local_3a8;
  string *option;
  iterator __end3;
  iterator __begin3;
  cmList *__range3;
  undefined1 local_380 [8];
  string cmakeConfigureCommand;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> gg;
  undefined1 local_350 [6];
  bool cmakeBuildTypeInOptions;
  bool multiConfig;
  undefined1 local_330 [8];
  ostringstream e;
  undefined1 local_1b8 [8];
  string cmakelists_file;
  string local_190;
  allocator<char> local_169;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  string *source_dir;
  allocator<char> local_111;
  string local_110;
  cmValue local_f0;
  cmValue cmakeGeneratorName;
  allocator<char> local_d9;
  string local_d8;
  cmValue local_b8;
  cmValue ctestConfigureCommand;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  string local_60;
  undefined1 local_30 [8];
  cmList options;
  cmCTestConfigureCommand *this_local;
  
  options.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cmList::cmList((cmList *)local_30);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    cmList::assign((cmList *)local_30,&this->Options,Yes,No);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"BuildDirectory",&local_81)
  ;
  cmCTest::GetCTestConfiguration(&local_60,pcVar1,&local_80);
  bVar3 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  if ((bVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,
               "Build directory not specified. Either use BUILD argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY variable"
               ,(allocator<char> *)((long)&ctestConfigureCommand.Value + 7));
    cmCommand::SetError((cmCommand *)this,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ctestConfigureCommand.Value + 7));
    this_local = (cmCTestConfigureCommand *)0x0;
    ctestConfigureCommand.Value._0_4_ = 1;
    goto LAB_002c9199;
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"CTEST_CONFIGURE_COMMAND",&local_d9);
  local_b8 = cmMakefile::GetDefinition(pcVar2,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  cmakeGeneratorName.Value = local_b8.Value;
  bVar4 = cmNonempty(local_b8);
  if (bVar4) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    psVar11 = cmValue::operator*[abi_cxx11_(&local_b8);
    cmCTest::SetCTestConfiguration
              (pcVar1,"ConfigureCommand",psVar11,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  }
  else {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"CTEST_CMAKE_GENERATOR",&local_111);
    local_f0 = cmMakefile::GetDefinition(pcVar2,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    source_dir = local_f0.Value;
    bVar4 = cmNonempty(local_f0);
    if (!bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,
                 "Configure command is not specified. If this is a \"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, set CTEST_CONFIGURE_COMMAND."
                 ,(allocator<char> *)((long)&labelsForSubprojects.Value + 7));
      cmCommand::SetError((cmCommand *)this,&local_4a8);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&labelsForSubprojects.Value + 7));
      this_local = (cmCTestConfigureCommand *)0x0;
      ctestConfigureCommand.Value._0_4_ = 1;
      goto LAB_002c9199;
    }
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"SourceDirectory",&local_169);
    cmCTest::GetCTestConfiguration(&local_148,pcVar1,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
    local_128 = &local_148;
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     local_128,"/CMakeLists.txt");
      bVar4 = cmsys::SystemTools::FileExists((string *)local_1b8);
      if (bVar4) {
        gg._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
        _M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
        super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl._7_1_ = 0;
        bVar4 = false;
        gname = cmMakefile::GetCMakeInstance
                          ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                           Makefile);
        psVar11 = cmValue::operator*[abi_cxx11_(&local_f0);
        cmake::CreateGlobalGenerator
                  ((cmake *)((long)&cmakeConfigureCommand.field_2 + 8),(string *)gname,
                   SUB81(psVar11,0));
        bVar5 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr *)(cmakeConfigureCommand.field_2._M_local_buf + 8));
        if (bVar5) {
          pcVar9 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                   operator->((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                               *)((long)&cmakeConfigureCommand.field_2 + 8));
          iVar6 = (*pcVar9->_vptr_cmGlobalGenerator[0x28])();
          gg._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
          _M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
          super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl._7_1_ = (byte)iVar6 & 1;
          std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::reset
                    ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                     ((long)&cmakeConfigureCommand.field_2 + 8),(pointer)0x0);
        }
        __range3._7_1_ = 0x22;
        psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        __range3._6_1_ = 0x22;
        cmStrCat<char,std::__cxx11::string_const&,char>
                  ((string *)local_380,(char *)((long)&__range3 + 7),psVar11,
                   (char *)((long)&__range3 + 6));
        __end3 = cmList::begin_abi_cxx11_((cmList *)local_30);
        option = (string *)cmList::end_abi_cxx11_((cmList *)local_30);
        while (bVar5 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&option), bVar5) {
          local_3a8 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
          std::__cxx11::string::operator+=((string *)local_380," \"");
          std::__cxx11::string::operator+=((string *)local_380,(string *)local_3a8);
          std::__cxx11::string::operator+=((string *)local_380,"\"");
          pcVar10 = (char *)std::__cxx11::string::c_str();
          pcVar10 = strstr(pcVar10,"CMAKE_BUILD_TYPE=");
          if (pcVar10 == (char *)0x0) {
            pcVar10 = (char *)std::__cxx11::string::c_str();
            pcVar10 = strstr(pcVar10,"CMAKE_BUILD_TYPE:STRING=");
            if (pcVar10 != (char *)0x0) goto LAB_002c8928;
          }
          else {
LAB_002c8928:
            bVar4 = true;
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        if ((gg._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl._7_1_ == 0) && (!bVar4))
        {
          cmCTest::GetConfigType_abi_cxx11_
                    ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            std::__cxx11::string::operator+=((string *)local_380," \"-DCMAKE_BUILD_TYPE:STRING=");
            psVar11 = cmCTest::GetConfigType_abi_cxx11_
                                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
            std::__cxx11::string::operator+=((string *)local_380,(string *)psVar11);
            std::__cxx11::string::operator+=((string *)local_380,"\"");
          }
        }
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"CTEST_USE_LAUNCHERS",
                   (allocator<char> *)((long)&cmakeGeneratorPlatform.Value + 7));
        bVar4 = cmMakefile::IsOn(pcVar2,&local_3c8);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&cmakeGeneratorPlatform.Value + 7));
        if (bVar4) {
          std::__cxx11::string::operator+=
                    ((string *)local_380," \"-DCTEST_USE_LAUNCHERS:BOOL=TRUE\"");
        }
        std::__cxx11::string::operator+=((string *)local_380," \"-G");
        psVar11 = cmValue::operator*[abi_cxx11_(&local_f0);
        std::__cxx11::string::operator+=((string *)local_380,(string *)psVar11);
        std::__cxx11::string::operator+=((string *)local_380,"\"");
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f8,"CTEST_CMAKE_GENERATOR_PLATFORM",&local_3f9);
        local_3d8 = cmMakefile::GetDefinition(pcVar2,&local_3f8);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::allocator<char>::~allocator(&local_3f9);
        cmakeGeneratorToolset.Value = local_3d8.Value;
        bVar4 = cmNonempty(local_3d8);
        if (bVar4) {
          std::__cxx11::string::operator+=((string *)local_380," \"-A");
          psVar11 = cmValue::operator*[abi_cxx11_(&local_3d8);
          std::__cxx11::string::operator+=((string *)local_380,(string *)psVar11);
          std::__cxx11::string::operator+=((string *)local_380,"\"");
        }
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_430,"CTEST_CMAKE_GENERATOR_TOOLSET",&local_431);
        local_410 = cmMakefile::GetDefinition(pcVar2,&local_430);
        std::__cxx11::string::~string((string *)&local_430);
        std::allocator<char>::~allocator(&local_431);
        local_440 = local_410.Value;
        bVar4 = cmNonempty(local_410);
        if (bVar4) {
          std::__cxx11::string::operator+=((string *)local_380," \"-T");
          psVar11 = cmValue::operator*[abi_cxx11_(&local_410);
          std::__cxx11::string::operator+=((string *)local_380,(string *)psVar11);
          std::__cxx11::string::operator+=((string *)local_380,"\"");
        }
        std::__cxx11::string::operator+=((string *)local_380," \"-S");
        std::__cxx11::string::operator+=((string *)local_380,(string *)local_128);
        std::__cxx11::string::operator+=((string *)local_380,"\"");
        std::__cxx11::string::operator+=((string *)local_380," \"-B");
        pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_480,"BuildDirectory",&local_481);
        cmCTest::GetCTestConfiguration(&local_460,pcVar1,&local_480);
        std::__cxx11::string::operator+=((string *)local_380,(string *)&local_460);
        std::__cxx11::string::~string((string *)&local_460);
        std::__cxx11::string::~string((string *)&local_480);
        std::allocator<char>::~allocator(&local_481);
        std::__cxx11::string::operator+=((string *)local_380,"\"");
        cmCTest::SetCTestConfiguration
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand"
                   ,(string *)local_380,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
        std::__cxx11::string::~string((string *)local_380);
        std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
                  ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                   ((long)&cmakeConfigureCommand.field_2 + 8));
        ctestConfigureCommand.Value._0_4_ = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
        poVar8 = std::operator<<((ostream *)local_330,"CMakeLists.txt file does not exist [");
        poVar8 = std::operator<<(poVar8,(string *)local_1b8);
        std::operator<<(poVar8,"]");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError((cmCommand *)this,(string *)local_350);
        std::__cxx11::string::~string((string *)local_350);
        this_local = (cmCTestConfigureCommand *)0x0;
        ctestConfigureCommand.Value._0_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
      }
      std::__cxx11::string::~string((string *)local_1b8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,
                 "Source directory not specified. Either use SOURCE argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY variable"
                 ,(allocator<char> *)(cmakelists_file.field_2._M_local_buf + 0xf));
      cmCommand::SetError((cmCommand *)this,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator
                ((allocator<char> *)(cmakelists_file.field_2._M_local_buf + 0xf));
      this_local = (cmCTestConfigureCommand *)0x0;
      ctestConfigureCommand.Value._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&local_148);
    if ((int)ctestConfigureCommand.Value != 0) goto LAB_002c9199;
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,"CTEST_LABELS_FOR_SUBPROJECTS",
             (allocator<char> *)((long)&handler + 7));
  local_4b8 = cmMakefile::GetDefinition(pcVar2,&local_4d8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&handler + 7));
  bVar4 = cmValue::operator_cast_to_bool(&local_4b8);
  if (bVar4) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    psVar11 = cmValue::operator*[abi_cxx11_(&local_4b8);
    cmCTest::SetCTestConfiguration
              (pcVar1,"LabelsForSubprojects",psVar11,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  }
  this_local = (cmCTestConfigureCommand *)
               cmCTest::GetConfigureHandler
                         ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(this_local->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand
    [3])();
  cmCTestGenericHandler::SetQuiet
            ((cmCTestGenericHandler *)this_local,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  ctestConfigureCommand.Value._0_4_ = 1;
LAB_002c9199:
  cmList::~cmList((cmList *)local_30);
  return (cmCTestGenericHandler *)this_local;
}

Assistant:

cmCTestGenericHandler* cmCTestConfigureCommand::InitializeHandler()
{
  cmList options;

  if (!this->Options.empty()) {
    options.assign(this->Options);
  }

  if (this->CTest->GetCTestConfiguration("BuildDirectory").empty()) {
    this->SetError(
      "Build directory not specified. Either use BUILD "
      "argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY "
      "variable");
    return nullptr;
  }

  cmValue ctestConfigureCommand =
    this->Makefile->GetDefinition("CTEST_CONFIGURE_COMMAND");

  if (cmNonempty(ctestConfigureCommand)) {
    this->CTest->SetCTestConfiguration("ConfigureCommand",
                                       *ctestConfigureCommand, this->Quiet);
  } else {
    cmValue cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");
    if (cmNonempty(cmakeGeneratorName)) {
      const std::string& source_dir =
        this->CTest->GetCTestConfiguration("SourceDirectory");
      if (source_dir.empty()) {
        this->SetError(
          "Source directory not specified. Either use SOURCE "
          "argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY "
          "variable");
        return nullptr;
      }

      const std::string cmakelists_file = source_dir + "/CMakeLists.txt";
      if (!cmSystemTools::FileExists(cmakelists_file)) {
        std::ostringstream e;
        e << "CMakeLists.txt file does not exist [" << cmakelists_file << "]";
        this->SetError(e.str());
        return nullptr;
      }

      bool multiConfig = false;
      bool cmakeBuildTypeInOptions = false;

      auto gg = this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
        *cmakeGeneratorName);
      if (gg) {
        multiConfig = gg->IsMultiConfig();
        gg.reset();
      }

      std::string cmakeConfigureCommand =
        cmStrCat('"', cmSystemTools::GetCMakeCommand(), '"');

      for (std::string const& option : options) {
        cmakeConfigureCommand += " \"";
        cmakeConfigureCommand += option;
        cmakeConfigureCommand += "\"";

        if ((nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE=")) ||
            (nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE:STRING="))) {
          cmakeBuildTypeInOptions = true;
        }
      }

      if (!multiConfig && !cmakeBuildTypeInOptions &&
          !this->CTest->GetConfigType().empty()) {
        cmakeConfigureCommand += " \"-DCMAKE_BUILD_TYPE:STRING=";
        cmakeConfigureCommand += this->CTest->GetConfigType();
        cmakeConfigureCommand += "\"";
      }

      if (this->Makefile->IsOn("CTEST_USE_LAUNCHERS")) {
        cmakeConfigureCommand += " \"-DCTEST_USE_LAUNCHERS:BOOL=TRUE\"";
      }

      cmakeConfigureCommand += " \"-G";
      cmakeConfigureCommand += *cmakeGeneratorName;
      cmakeConfigureCommand += "\"";

      cmValue cmakeGeneratorPlatform =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_PLATFORM");
      if (cmNonempty(cmakeGeneratorPlatform)) {
        cmakeConfigureCommand += " \"-A";
        cmakeConfigureCommand += *cmakeGeneratorPlatform;
        cmakeConfigureCommand += "\"";
      }

      cmValue cmakeGeneratorToolset =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_TOOLSET");
      if (cmNonempty(cmakeGeneratorToolset)) {
        cmakeConfigureCommand += " \"-T";
        cmakeConfigureCommand += *cmakeGeneratorToolset;
        cmakeConfigureCommand += "\"";
      }

      cmakeConfigureCommand += " \"-S";
      cmakeConfigureCommand += source_dir;
      cmakeConfigureCommand += "\"";

      cmakeConfigureCommand += " \"-B";
      cmakeConfigureCommand +=
        this->CTest->GetCTestConfiguration("BuildDirectory");
      cmakeConfigureCommand += "\"";

      this->CTest->SetCTestConfiguration("ConfigureCommand",
                                         cmakeConfigureCommand, this->Quiet);
    } else {
      this->SetError(
        "Configure command is not specified. If this is a "
        "\"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, "
        "set CTEST_CONFIGURE_COMMAND.");
      return nullptr;
    }
  }

  if (cmValue labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       *labelsForSubprojects, this->Quiet);
  }

  cmCTestConfigureHandler* handler = this->CTest->GetConfigureHandler();
  handler->Initialize();
  handler->SetQuiet(this->Quiet);
  return handler;
}